

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

int in_tab(h264_cabac_se_val *tab,uint32_t val)

{
  int iVar1;
  
  iVar1 = tab->blen;
  do {
    if (iVar1 == 0) {
      return 0;
    }
    if (tab->subtab == (h264_cabac_se_val *)0x0) {
      if (tab->val == val) {
        return 1;
      }
    }
    else {
      iVar1 = in_tab(tab->subtab,val);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = tab[1].blen;
    tab = tab + 1;
  } while( true );
}

Assistant:

static int in_tab(const struct h264_cabac_se_val *tab, uint32_t val) {
	int i;
	for (i = 0; tab[i].blen; i++) {
		if (tab[i].subtab) {
			if (in_tab(tab[i].subtab, val))
				return 1;
		} else {
			if (val == tab[i].val)
				return 1;
		}
	}
	return 0;
}